

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidateDataStructure.cpp
# Opt level: O1

void __thiscall Assimp::ValidateDSProcess::Validate(ValidateDSProcess *this,aiAnimation *pAnimation)

{
  long lVar1;
  aiNodeAnim *pNodeAnim;
  aiMeshMorphAnim *pMeshMorphAnim;
  char *pcVar2;
  ulong uVar3;
  
  Validate(this,&pAnimation->mName);
  if ((pAnimation->mNumChannels == 0) && (pAnimation->mNumMorphMeshChannels == 0)) {
    ReportError(this,
                "aiAnimation::mNumChannels is 0. At least one node animation channel must be there."
               );
  }
  if ((pAnimation->mNumChannels == 0) || (pAnimation->mChannels != (aiNodeAnim **)0x0)) {
    if ((pAnimation->mMorphMeshChannels != (aiMeshMorphAnim **)0x0) ||
       (pAnimation->mNumMorphMeshChannels == 0)) {
      if (pAnimation->mNumChannels == 0) {
LAB_00308f9c:
        if (pAnimation->mNumMorphMeshChannels == 0) {
          return;
        }
        uVar3 = 0;
        pMeshMorphAnim = *pAnimation->mMorphMeshChannels;
        while (pMeshMorphAnim != (aiMeshMorphAnim *)0x0) {
          Validate(this,pAnimation,pMeshMorphAnim);
          if (pAnimation->mNumMorphMeshChannels <= (int)uVar3 + 1U) {
            return;
          }
          lVar1 = uVar3 + 1;
          uVar3 = uVar3 + 1;
          pMeshMorphAnim = pAnimation->mMorphMeshChannels[lVar1];
        }
        pcVar2 = 
        "aiAnimation::mMorphMeshChannels[%i] is NULL (aiAnimation::mNumMorphMeshChannels is %i)";
      }
      else {
        uVar3 = 0;
        pNodeAnim = *pAnimation->mChannels;
        while (pNodeAnim != (aiNodeAnim *)0x0) {
          Validate(this,pAnimation,pNodeAnim);
          if (pAnimation->mNumChannels <= (int)uVar3 + 1U) goto LAB_00308f9c;
          lVar1 = uVar3 + 1;
          uVar3 = uVar3 + 1;
          pNodeAnim = pAnimation->mChannels[lVar1];
        }
        pcVar2 = "aiAnimation::mChannels[%i] is NULL (aiAnimation::mNumChannels is %i)";
      }
      ReportError(this,pcVar2,uVar3 & 0xffffffff);
    }
    pcVar2 = "aiAnimation::mMorphMeshChannels is NULL (aiAnimation::mNumMorphMeshChannels is %i)";
  }
  else {
    pcVar2 = "aiAnimation::mChannels is NULL (aiAnimation::mNumChannels is %i)";
  }
  ReportError(this,pcVar2);
}

Assistant:

void ValidateDSProcess::Validate( const aiAnimation* pAnimation)
{
    Validate(&pAnimation->mName);

    // validate all animations
    if (pAnimation->mNumChannels || pAnimation->mNumMorphMeshChannels)
    {
        if (!pAnimation->mChannels && pAnimation->mNumChannels) {
            ReportError("aiAnimation::mChannels is NULL (aiAnimation::mNumChannels is %i)",
                pAnimation->mNumChannels);
        }
        if (!pAnimation->mMorphMeshChannels && pAnimation->mNumMorphMeshChannels) {
            ReportError("aiAnimation::mMorphMeshChannels is NULL (aiAnimation::mNumMorphMeshChannels is %i)",
                pAnimation->mNumMorphMeshChannels);
        }
        for (unsigned int i = 0; i < pAnimation->mNumChannels;++i)
        {
            if (!pAnimation->mChannels[i])
            {
                ReportError("aiAnimation::mChannels[%i] is NULL (aiAnimation::mNumChannels is %i)",
                    i, pAnimation->mNumChannels);
            }
            Validate(pAnimation, pAnimation->mChannels[i]);
        }
        for (unsigned int i = 0; i < pAnimation->mNumMorphMeshChannels;++i)
        {
            if (!pAnimation->mMorphMeshChannels[i])
            {
                ReportError("aiAnimation::mMorphMeshChannels[%i] is NULL (aiAnimation::mNumMorphMeshChannels is %i)",
                    i, pAnimation->mNumMorphMeshChannels);
            }
            Validate(pAnimation, pAnimation->mMorphMeshChannels[i]);
        }
    }
    else {
    	ReportError("aiAnimation::mNumChannels is 0. At least one node animation channel must be there.");
    }
}